

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void checkArguments(char **argv,size_t *numProducers,size_t *numConsumers,size_t *buffer_capacity,
                   size_t *target)

{
  char *__nptr;
  int *piVar1;
  uintmax_t uVar2;
  ostream *poVar3;
  size_t *psVar4;
  long lVar5;
  
  lVar5 = 1;
  while( true ) {
    __nptr = argv[lVar5];
    if (*__nptr == '-') break;
    piVar1 = __errno_location();
    *piVar1 = 0;
    uVar2 = strtoumax(__nptr,(char **)0x0,10);
    if ((*piVar1 == 0x22) || (uVar2 == 0)) break;
    psVar4 = numProducers;
    switch((uint)lVar5 & 0xff) {
    case 1:
      break;
    case 2:
      psVar4 = numConsumers;
      break;
    case 3:
      psVar4 = buffer_capacity;
      break;
    case 4:
      *target = uVar2;
      return;
    default:
      goto switchD_0010362c_default;
    }
    *psVar4 = uVar2;
switchD_0010362c_default:
    lVar5 = lVar5 + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"argument ");
  poVar3 = std::operator<<(poVar3,(char)lVar5);
  poVar3 = std::operator<<(poVar3," (\'");
  poVar3 = std::operator<<(poVar3,argv[lVar5]);
  poVar3 = std::operator<<(poVar3,
                           "\') not valid. Please provide a positive integer no greater than ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar3 = std::operator<<(poVar3,*argv);
  poVar3 = std::operator<<(poVar3,
                           " <# producer threads> <# consumer threads> <buffer size> <# items to produce>"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void checkArguments(const char *argv[], std::size_t *numProducers, std::size_t *numConsumers, std::size_t *buffer_capacity, std::size_t *target){
    std::size_t argCheck;
    unsigned char i = 1;
    for(; i < 5; ++i){//Ensure all provided arguments are valid
	if(argv[i][0] == '-')
	    break;
	errno = 0;
	argCheck = std::strtoumax(argv[i], NULL, 10);
	if(errno == ERANGE || argCheck == 0)
	    break;
        switch(i){
            case 1:
                *numProducers = argCheck;
                continue;
            case 2:
                *numConsumers = argCheck;
                continue;
            case 3:
		*buffer_capacity = argCheck;
                continue;
            case 4:
		*target = argCheck;
		return;
        }
    }
    std::cerr << "argument " << i << " (\'" << argv[i] << "\') not valid. Please provide a positive integer no greater than " << SIZE_MAX << std::endl;
    std::cerr << "Usage: " << argv[0] << " <# producer threads> <# consumer threads> <buffer size> <# items to produce>" << std::endl;
}